

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerResults.cpp
# Opt level: O2

void __thiscall
HD44780AnalyzerResults::GenerateBubbleText
          (HD44780AnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  size_t sVar1;
  char *pcVar2;
  undefined4 uVar3;
  HD44780AnalyzerResults *this_00;
  Frame frame;
  char s1 [256];
  undefined8 local_1d0 [2];
  ulonglong local_1c0;
  ushort local_1b0;
  char number_str [128];
  char s2 [256];
  
  Frame::Frame(&frame);
  AnalyzerResults::GetFrame((ulonglong)local_1d0);
  _frame = local_1d0[0];
  Frame::~Frame((Frame *)local_1d0);
  AnalyzerResults::ClearResultStrings();
  AnalyzerHelpers::GetNumberString(local_1c0,display_base,8,number_str,0x80);
  strcpy(s1,number_str);
  AnalyzerResults::AddResultString((char *)this,s1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  s1._0_2_ = (ushort)((local_1b0 & 0x200) == 0) * 5 + 0x52;
  sVar1 = strlen(s1);
  pcVar2 = s1 + sVar1;
  if ((local_1b0 & 0x100) == 0) {
    s1[sVar1 + 2] = '\0';
    pcVar2[0] = 'C';
    pcVar2[1] = ' ';
  }
  else {
    s1[sVar1 + 2] = '\0';
    pcVar2[0] = 'D';
    pcVar2[1] = ' ';
  }
  strcat(s1,number_str);
  AnalyzerResults::AddResultString((char *)this,s1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  uVar3 = 0x206452;
  if ((local_1b0 & 0x200) == 0) {
    uVar3 = 0x207257;
  }
  s1._0_2_ = (undefined2)uVar3;
  s1[2] = (char)((uint)uVar3 >> 0x10);
  s1[3] = '\0';
  sVar1 = strlen(s1);
  uVar3 = 0x207444;
  if ((local_1b0 & 0x100) == 0) {
    uVar3 = 0x206d43;
  }
  *(undefined4 *)(s1 + sVar1) = uVar3;
  strcat(s1,number_str);
  AnalyzerResults::AddResultString((char *)this,s1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if ((local_1b0 & 0x200) == 0) {
    builtin_strncpy(s1,"Write ",7);
  }
  else {
    builtin_strncpy(s1,"Read ",6);
  }
  sVar1 = strlen(s1);
  if ((local_1b0 & 0x100) == 0) {
    builtin_strncpy(s1 + sVar1,"Command ",9);
  }
  else {
    builtin_strncpy(s1 + sVar1,"Data ",6);
  }
  strcat(s1,number_str);
  this_00 = this;
  AnalyzerResults::AddResultString((char *)this,s1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  HD44780Decode(this_00,&frame,s2,display_base);
  sVar1 = strlen(s1);
  (s1 + sVar1)[0] = ' ';
  (s1 + sVar1)[1] = '(';
  s1[sVar1 + 2] = '\0';
  strcat(s1,s2);
  sVar1 = strlen(s1);
  (s1 + sVar1)[0] = ')';
  (s1 + sVar1)[1] = '\0';
  AnalyzerResults::AddResultString((char *)this,s1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void HD44780AnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    char s1[ 256 ], s2[ 256 ], number_str[ 128 ];
    Frame frame;

    frame = GetFrame( frame_index );
    ClearResultStrings();
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    // string 1
    strcpy( s1, number_str );
    AddResultString( s1 );

    // string 2
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "R" );
    else
        strcpy( s1, "W" );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "D " );
    else
        strcat( s1, "C " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 3
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Rd " );
    else
        strcpy( s1, "Wr " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Dt " );
    else
        strcat( s1, "Cm " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 4
    if( frame.mFlags & _BV( MFLAG_RW ) )
        strcpy( s1, "Read " );
    else
        strcpy( s1, "Write " );

    if( frame.mFlags & _BV( MFLAG_RS ) )
        strcat( s1, "Data " );
    else
        strcat( s1, "Command " );

    strcat( s1, number_str );
    AddResultString( s1 );

    // string 5 (adds to string 4)
    HD44780Decode( &frame, s2, display_base );
    strcat( s1, " (" );
    strcat( s1, s2 );
    strcat( s1, ")" );
    AddResultString( s1 );
}